

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall
flatbuffers::cpp::CppGenerator::GenEnumObjectBasedAPI(CppGenerator *this,EnumDef *enum_def)

{
  CodeWriter *this_00;
  EnumDef *pEVar1;
  EnumVal *pEVar2;
  pointer ppEVar3;
  allocator<char> local_659;
  string native_type;
  allocator<char> local_629;
  EnumDef *local_628;
  string local_620;
  IDLOptions *local_600;
  string local_5f8;
  pointer local_5d8;
  string local_5d0;
  string local_5b0;
  string local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (((this->opts_).super_IDLOptions.generate_object_based_api == true) &&
     (enum_def->is_union == true)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&native_type,"NAME",(allocator<char> *)&local_5f8);
    EscapeKeyword(&local_620,this,(string *)enum_def);
    this_00 = &this->code_;
    CodeWriter::SetValue(this_00,&native_type,&local_620);
    std::__cxx11::string::~string((string *)&local_620);
    std::__cxx11::string::~string((string *)&native_type);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&native_type,"NONE",(allocator<char> *)&local_620);
    pEVar2 = SymbolTable<flatbuffers::EnumVal>::Lookup(&enum_def->vals,&native_type);
    if (pEVar2 == (EnumVal *)0x0) {
      __assert_fail("enum_def.Lookup(\"NONE\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                    ,0x561,
                    "void flatbuffers::cpp::CppGenerator::GenEnumObjectBasedAPI(const EnumDef &)");
    }
    std::__cxx11::string::~string((string *)&native_type);
    std::__cxx11::string::string<std::allocator<char>>((string *)&native_type,"NONE",&local_659);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f8,"NONE",&local_629);
    pEVar2 = SymbolTable<flatbuffers::EnumVal>::Lookup(&enum_def->vals,&local_5f8);
    GetEnumValUse_abi_cxx11_(&local_620,this,enum_def,pEVar2);
    CodeWriter::SetValue(this_00,&native_type,&local_620);
    local_600 = &(this->opts_).super_IDLOptions;
    std::__cxx11::string::~string((string *)&local_620);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::__cxx11::string::~string((string *)&native_type);
    local_628 = enum_def;
    if (enum_def->uses_multiple_type_instances == false) {
      ppEVar3 = (enum_def->vals).vec.
                super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        if (ppEVar3 ==
            (local_628->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) break;
        pEVar2 = *ppEVar3;
        if (ppEVar3 ==
            (local_628->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d0,"template<typename T> struct {{NAME}}UnionTraits {",
                     (allocator<char> *)&native_type);
          CodeWriter::operator+=(this_00,&local_1d0);
          std::__cxx11::string::~string((string *)&local_1d0);
        }
        else {
          GetUnionElement_abi_cxx11_(&native_type,this,pEVar2,true,local_600);
          std::operator+(&local_620,"template<> struct {{NAME}}UnionTraits<",&native_type);
          std::operator+(&local_50,&local_620,"> {");
          CodeWriter::operator+=(this_00,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_620);
          std::__cxx11::string::~string((string *)&native_type);
        }
        GetEnumValUse_abi_cxx11_(&native_type,this,local_628,pEVar2);
        std::operator+(&local_620,"  static const {{ENUM_NAME}} enum_value = ",&native_type);
        std::operator+(&local_70,&local_620,";");
        CodeWriter::operator+=(this_00,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_620);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"};",(allocator<char> *)&local_620);
        CodeWriter::operator+=(this_00,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"",(allocator<char> *)&local_620);
        CodeWriter::operator+=(this_00,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&native_type);
        ppEVar3 = ppEVar3 + 1;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,"struct {{NAME}}Union {",(allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_1f0);
    pEVar1 = local_628;
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"  {{NAME}} type;",(allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"  void *value;",(allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"",(allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"  {{NAME}}Union() : type({{NONE}}), value(nullptr) {}",
               (allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"  {{NAME}}Union({{NAME}}Union&& u) FLATBUFFERS_NOEXCEPT :",
               (allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"    type({{NONE}}), value(nullptr)",
               (allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"    { std::swap(type, u.type); std::swap(value, u.value); }",
               (allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,"  {{NAME}}Union(const {{NAME}}Union &);",
               (allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,"  {{NAME}}Union &operator=(const {{NAME}}Union &u)",
               (allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_310);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_330,
               "    { {{NAME}}Union t(u); std::swap(type, t.type); std::swap(value, t.value); return *this; }"
               ,(allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_330);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,
               "  {{NAME}}Union &operator=({{NAME}}Union &&u) FLATBUFFERS_NOEXCEPT",
               (allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_350);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_370,
               "    { std::swap(type, u.type); std::swap(value, u.value); return *this; }",
               (allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_390,"  ~{{NAME}}Union() { Reset(); }",
               (allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_390);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b0,"",(allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_3b0);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d0,"  void Reset();",(allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_3d0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f0,"",(allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_3f0);
    std::__cxx11::string::~string((string *)&local_3f0);
    if (pEVar1->uses_multiple_type_instances == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_410,"  template <typename T>",(allocator<char> *)&native_type);
      CodeWriter::operator+=(this_00,&local_410);
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_430,"  void Set(T&& val) {",(allocator<char> *)&native_type);
      CodeWriter::operator+=(this_00,&local_430);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_450,"    typedef typename std::remove_reference<T>::type RT;",
                 (allocator<char> *)&native_type);
      CodeWriter::operator+=(this_00,&local_450);
      std::__cxx11::string::~string((string *)&local_450);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_470,"    Reset();",(allocator<char> *)&native_type);
      CodeWriter::operator+=(this_00,&local_470);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_490,"    type = {{NAME}}UnionTraits<RT>::enum_value;",
                 (allocator<char> *)&native_type);
      CodeWriter::operator+=(this_00,&local_490);
      std::__cxx11::string::~string((string *)&local_490);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4b0,"    if (type != {{NONE}}) {",(allocator<char> *)&native_type)
      ;
      CodeWriter::operator+=(this_00,&local_4b0);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4d0,"      value = new RT(std::forward<T>(val));",
                 (allocator<char> *)&native_type);
      CodeWriter::operator+=(this_00,&local_4d0);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4f0,"    }",(allocator<char> *)&native_type);
      CodeWriter::operator+=(this_00,&local_4f0);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_510,"  }",(allocator<char> *)&native_type);
      CodeWriter::operator+=(this_00,&local_510);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_530,"",(allocator<char> *)&native_type);
      CodeWriter::operator+=(this_00,&local_530);
      std::__cxx11::string::~string((string *)&local_530);
    }
    UnionUnPackSignature_abi_cxx11_(&local_620,this,pEVar1,true);
    std::operator+(&native_type,"  ",&local_620);
    std::operator+(&local_550,&native_type,";");
    CodeWriter::operator+=(this_00,&local_550);
    std::__cxx11::string::~string((string *)&local_550);
    std::__cxx11::string::~string((string *)&native_type);
    std::__cxx11::string::~string((string *)&local_620);
    UnionPackSignature_abi_cxx11_(&local_620,this,pEVar1,true);
    std::operator+(&native_type,"  ",&local_620);
    std::operator+(&local_570,&native_type,";");
    CodeWriter::operator+=(this_00,&local_570);
    std::__cxx11::string::~string((string *)&local_570);
    std::__cxx11::string::~string((string *)&native_type);
    std::__cxx11::string::~string((string *)&local_620);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_590,"",(allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_590);
    std::__cxx11::string::~string((string *)&local_590);
    local_5d8 = (pEVar1->vals).vec.
                super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    for (ppEVar3 = (pEVar1->vals).vec.
                   super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppEVar3 != local_5d8;
        ppEVar3 = ppEVar3 + 1) {
      pEVar2 = *ppEVar3;
      if (pEVar2->value != 0) {
        GetUnionElement_abi_cxx11_(&native_type,this,pEVar2,true,local_600);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_620,"NATIVE_TYPE",(allocator<char> *)&local_5f8);
        CodeWriter::SetValue(this_00,&local_620,&native_type);
        std::__cxx11::string::~string((string *)&local_620);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_620,"NATIVE_NAME",&local_659);
        EscapeKeyword(&local_5f8,this,&pEVar2->name);
        CodeWriter::SetValue(this_00,&local_620,&local_5f8);
        std::__cxx11::string::~string((string *)&local_5f8);
        std::__cxx11::string::~string((string *)&local_620);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_620,"NATIVE_ID",&local_659);
        GetEnumValUse_abi_cxx11_(&local_5f8,this,local_628,pEVar2);
        CodeWriter::SetValue(this_00,&local_620,&local_5f8);
        std::__cxx11::string::~string((string *)&local_5f8);
        std::__cxx11::string::~string((string *)&local_620);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"  {{NATIVE_TYPE}} *As{{NATIVE_NAME}}() {",
                   (allocator<char> *)&local_620);
        CodeWriter::operator+=(this_00,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"    return type == {{NATIVE_ID}} ?",
                   (allocator<char> *)&local_620);
        CodeWriter::operator+=(this_00,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,
                   "      reinterpret_cast<{{NATIVE_TYPE}} *>(value) : nullptr;",
                   (allocator<char> *)&local_620);
        CodeWriter::operator+=(this_00,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"  }",(allocator<char> *)&local_620);
        CodeWriter::operator+=(this_00,&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_150,"  const {{NATIVE_TYPE}} *As{{NATIVE_NAME}}() const {",
                   (allocator<char> *)&local_620);
        CodeWriter::operator+=(this_00,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"    return type == {{NATIVE_ID}} ?",
                   (allocator<char> *)&local_620);
        CodeWriter::operator+=(this_00,&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_190,
                   "      reinterpret_cast<const {{NATIVE_TYPE}} *>(value) : nullptr;",
                   (allocator<char> *)&local_620);
        CodeWriter::operator+=(this_00,&local_190);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b0,"  }",(allocator<char> *)&local_620);
        CodeWriter::operator+=(this_00,&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&native_type);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5b0,"};",(allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_5b0);
    pEVar1 = local_628;
    std::__cxx11::string::~string((string *)&local_5b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5d0,"",(allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_5d0);
    std::__cxx11::string::~string((string *)&local_5d0);
    GenEnumEquals(this,pEVar1);
  }
  return;
}

Assistant:

void GenEnumObjectBasedAPI(const EnumDef &enum_def) {
    if (!(opts_.generate_object_based_api && enum_def.is_union)) { return; }
    code_.SetValue("NAME", Name(enum_def));
    FLATBUFFERS_ASSERT(enum_def.Lookup("NONE"));
    code_.SetValue("NONE", GetEnumValUse(enum_def, *enum_def.Lookup("NONE")));

    if (!enum_def.uses_multiple_type_instances) {
      for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end();
           ++it) {
        const auto &ev = **it;

        if (it == enum_def.Vals().begin()) {
          code_ += "template<typename T> struct {{NAME}}UnionTraits {";
        } else {
          auto name = GetUnionElement(ev, true, opts_);
          code_ += "template<> struct {{NAME}}UnionTraits<" + name + "> {";
        }

        auto value = GetEnumValUse(enum_def, ev);
        code_ += "  static const {{ENUM_NAME}} enum_value = " + value + ";";
        code_ += "};";
        code_ += "";
      }
    }

    code_ += "struct {{NAME}}Union {";
    code_ += "  {{NAME}} type;";
    code_ += "  void *value;";
    code_ += "";
    code_ += "  {{NAME}}Union() : type({{NONE}}), value(nullptr) {}";
    code_ += "  {{NAME}}Union({{NAME}}Union&& u) FLATBUFFERS_NOEXCEPT :";
    code_ += "    type({{NONE}}), value(nullptr)";
    code_ += "    { std::swap(type, u.type); std::swap(value, u.value); }";
    code_ += "  {{NAME}}Union(const {{NAME}}Union &);";
    code_ += "  {{NAME}}Union &operator=(const {{NAME}}Union &u)";
    code_ +=
        "    { {{NAME}}Union t(u); std::swap(type, t.type); std::swap(value, "
        "t.value); return *this; }";
    code_ +=
        "  {{NAME}}Union &operator=({{NAME}}Union &&u) FLATBUFFERS_NOEXCEPT";
    code_ +=
        "    { std::swap(type, u.type); std::swap(value, u.value); return "
        "*this; }";
    code_ += "  ~{{NAME}}Union() { Reset(); }";
    code_ += "";
    code_ += "  void Reset();";
    code_ += "";
    if (!enum_def.uses_multiple_type_instances) {
      code_ += "  template <typename T>";
      code_ += "  void Set(T&& val) {";
      code_ += "    typedef typename std::remove_reference<T>::type RT;";
      code_ += "    Reset();";
      code_ += "    type = {{NAME}}UnionTraits<RT>::enum_value;";
      code_ += "    if (type != {{NONE}}) {";
      code_ += "      value = new RT(std::forward<T>(val));";
      code_ += "    }";
      code_ += "  }";
      code_ += "";
    }
    code_ += "  " + UnionUnPackSignature(enum_def, true) + ";";
    code_ += "  " + UnionPackSignature(enum_def, true) + ";";
    code_ += "";

    for (const auto ev : enum_def.Vals()) {
      if (ev->IsZero()) { continue; }

      const auto native_type = GetUnionElement(*ev, true, opts_);
      code_.SetValue("NATIVE_TYPE", native_type);
      code_.SetValue("NATIVE_NAME", Name(*ev));
      code_.SetValue("NATIVE_ID", GetEnumValUse(enum_def, *ev));

      code_ += "  {{NATIVE_TYPE}} *As{{NATIVE_NAME}}() {";
      code_ += "    return type == {{NATIVE_ID}} ?";
      code_ += "      reinterpret_cast<{{NATIVE_TYPE}} *>(value) : nullptr;";
      code_ += "  }";

      code_ += "  const {{NATIVE_TYPE}} *As{{NATIVE_NAME}}() const {";
      code_ += "    return type == {{NATIVE_ID}} ?";
      code_ +=
          "      reinterpret_cast<const {{NATIVE_TYPE}} *>(value) : nullptr;";
      code_ += "  }";
    }
    code_ += "};";
    code_ += "";

    GenEnumEquals(enum_def);
  }